

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_map.c
# Opt level: O1

int log_map_iterator_next(log_map_iterator iterator)

{
  ulong uVar1;
  log_map_bucket_conflict plVar2;
  ulong uVar3;
  
  if (iterator != (log_map_iterator)0x0) {
    plVar2 = iterator->next;
    uVar1 = (iterator->map->table).size;
    uVar3 = iterator->position;
    if (uVar3 < uVar1) {
      do {
        for (; plVar2 != (log_map_bucket_conflict)0x0; plVar2 = plVar2->next) {
          if ((plVar2->key != (char *)0x0) && (plVar2->value != (void *)0x0)) {
            iterator->bucket = plVar2;
            iterator->next = plVar2->next;
            return 0;
          }
        }
        uVar3 = uVar3 + 1;
        iterator->position = uVar3;
        plVar2 = (iterator->map->table).data + uVar3;
      } while (uVar3 != uVar1);
    }
    iterator->bucket = plVar2;
  }
  return 1;
}

Assistant:

int log_map_iterator_next(log_map_iterator iterator)
{
	if (iterator == NULL)
	{
		return 1;
	}

	iterator->bucket = iterator->next;

	while (iterator->position < iterator->map->table.size)
	{
		while (iterator->bucket != NULL)
		{
			if (iterator->bucket->key != NULL && iterator->bucket->value != NULL)
			{
				iterator->next = iterator->bucket->next;

				return 0;
			}

			iterator->bucket = iterator->bucket->next;
		}

		++iterator->position;

		iterator->bucket = &iterator->map->table.data[iterator->position];
	}

	return 1;
}